

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fp8.cpp
# Opt level: O1

float __thiscall MILBlob::Fp8E5M2::GetFloat(Fp8E5M2 *this)

{
  byte bVar1;
  float fVar2;
  uint uVar3;
  float fVar4;
  
  bVar1 = (this->data).byte;
  uVar3 = (uint)bVar1;
  fVar2 = (float)((uVar3 & 0xffffff80) * 0x1000000);
  if ((bVar1 & 0x7c) == 0x7c) {
    return (float)((int)fVar2 + (uVar3 & 3) + 0x7f800000);
  }
  fVar4 = fVar2;
  if ((bVar1 & 0x7f) != 0) {
    fVar4 = (float)((int)fVar2 + (uVar3 & 0x7f) * 0x200000 + 0x38000000);
  }
  if ((bVar1 & 3) == 0 || (bVar1 & 0x7c) != 0) {
    return fVar4;
  }
  uVar3 = (int)fVar4 + 0x800000U & 0x7f800000;
  return (float)((uint)fVar4 & 0x807fffff | uVar3) - (float)(uVar3 | (uint)fVar2);
}

Assistant:

float Fp8E5M2::GetFloat() const
{
    FloatCast fp32 = {.f = 0};
    // Set the sign bit.
    fp32.components.sign = data.components.sign;

    // Standard NaN/Inf case. We just use the fp8 mantissa as there's
    // no strong requirements for mantissa in the NaN case.
    if (data.components.exponent == (0x1 << fp8ExponentBits) - 1) {
        fp32.components.exponent = 0xFF;
        fp32.components.mantissa = data.components.mantissa;
        return fp32.f;
    }
    HandleFp8ToFp32ExponentMantissa<Fp8E5M2, Fp8E5M2::Cast>(data, fp32);
    HandleFp8ToFp32Denormalize(data, fp32);
    return fp32.f;
}